

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::CreateTexture_3DGS_MDL4
          (MDLImporter *this,uchar *szData,uint iType,uint *piSkip)

{
  uint *puVar1;
  uint uVar2;
  uchar *puVar3;
  Logger *this_00;
  aiTexture *pcNew;
  aiTexture **ppaVar4;
  aiScene *paVar5;
  aiTexture **ppaVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (piSkip == (uint *)0x0) {
    __assert_fail("__null != piSkip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0xb8,
                  "void Assimp::MDLImporter::CreateTexture_3DGS_MDL4(const unsigned char *, unsigned int, unsigned int *)"
                 );
  }
  if (iType == 1 || 3 < iType) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"Unsupported texture file format");
    return;
  }
  puVar3 = this->mBuffer;
  uVar2 = *piSkip;
  pcNew = (aiTexture *)operator_new(0x428);
  pcNew->mWidth = 0;
  pcNew->mHeight = 0;
  pcNew->pcData = (aiTexel *)0x0;
  (pcNew->mFilename).length = 0;
  (pcNew->mFilename).data[0] = '\0';
  memset((pcNew->mFilename).data + 1,0x1b,0x3ff);
  pcNew->achFormatHint[0] = '\0';
  pcNew->achFormatHint[1] = '\0';
  pcNew->achFormatHint[2] = '\0';
  pcNew->achFormatHint[3] = '\0';
  pcNew->mWidth = *(uint *)(puVar3 + 0x34);
  pcNew->mHeight = *(uint *)(puVar3 + 0x38);
  if (uVar2 == 0xffffffff) {
    pcNew->pcData = (aiTexel *)0xffffffffffffffff;
    ParseTextureColorData(this,szData,iType,piSkip,pcNew);
    pcNew->pcData = (aiTexel *)0x0;
    operator_delete(pcNew,0x428);
    return;
  }
  ParseTextureColorData(this,szData,iType,piSkip,pcNew);
  paVar5 = this->pScene;
  if (paVar5->mNumTextures == 0) {
    paVar5->mNumTextures = 1;
    ppaVar6 = (aiTexture **)operator_new__(8);
    this->pScene->mTextures = ppaVar6;
    *this->pScene->mTextures = pcNew;
  }
  else {
    ppaVar6 = paVar5->mTextures;
    ppaVar4 = (aiTexture **)operator_new__((ulong)(paVar5->mNumTextures + 1) << 3);
    paVar5->mTextures = ppaVar4;
    paVar5 = this->pScene;
    uVar7 = (ulong)paVar5->mNumTextures;
    if (paVar5->mNumTextures != 0) {
      uVar8 = 0;
      do {
        paVar5->mTextures[uVar8] = ppaVar6[uVar8];
        uVar8 = uVar8 + 1;
        paVar5 = this->pScene;
        uVar7 = (ulong)paVar5->mNumTextures;
      } while (uVar8 < uVar7);
    }
    paVar5->mTextures[uVar7] = pcNew;
    puVar1 = &this->pScene->mNumTextures;
    *puVar1 = *puVar1 + 1;
    if (ppaVar6 != (aiTexture **)0x0) {
      operator_delete__(ppaVar6);
      return;
    }
  }
  return;
}

Assistant:

void MDLImporter::CreateTexture_3DGS_MDL4(const unsigned char* szData,
    unsigned int iType,
     unsigned int* piSkip)
{
    ai_assert(NULL != piSkip);

    const MDL::Header *pcHeader = (const MDL::Header*)mBuffer;  //the endianness is already corrected in the InternReadFile_3DGS_MDL345 function

    if (iType == 1 || iType > 3)
    {
        ASSIMP_LOG_ERROR("Unsupported texture file format");
        return;
    }

    const bool bNoRead = *piSkip == UINT_MAX;

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();
    pcNew->mWidth = pcHeader->skinwidth;
    pcNew->mHeight = pcHeader->skinheight;

    if (bNoRead)pcNew->pcData = bad_texel;
    ParseTextureColorData(szData,iType,piSkip,pcNew);

    // store the texture
    if (!bNoRead)
    {
        if (!this->pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew;
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < this->pScene->mNumTextures;++i)
                pScene->mTextures[i] = pc[i];
            pScene->mTextures[pScene->mNumTextures] = pcNew;
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    else {
        pcNew->pcData = NULL;
        delete pcNew;
    }
    return;
}